

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-automation.cpp
# Opt level: O3

void test_macro_learn(void)

{
  _Manager_type p_Var1;
  Dummy d;
  AutomationMgr mgr;
  _Any_data __tmp;
  undefined8 local_b0;
  _Any_data local_a8;
  _Manager_type local_98;
  _Invoker_type local_90;
  AutomationMgr local_80;
  
  printf("\n\n#SUITE: %s\n","test_macro_learn");
  rtosc::AutomationMgr::AutomationMgr(&local_80,4,2,0x10);
  local_b0 = 0;
  rtosc::AutomationMgr::set_ports(&local_80,&p);
  rtosc::AutomationMgr::set_instance(&local_80,&local_b0);
  p_Var1 = local_80.backend.super__Function_base._M_manager;
  local_80.backend.super__Function_base._M_functor._8_8_ = 0;
  local_98 = local_80.backend.super__Function_base._M_manager;
  local_80.backend.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fundamental[P]rtosc/test/test-automation.cpp:196:19)>
       ::_M_manager;
  local_90 = local_80.backend._M_invoker;
  local_80.backend._M_invoker =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fundamental[P]rtosc/test/test-automation.cpp:196:19)>
       ::_M_invoke;
  local_80.backend.super__Function_base._M_functor._M_unused._M_object = &local_b0;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)(&local_a8,&local_a8,__destroy_functor);
  }
  rtosc::AutomationMgr::createBinding(&local_80,0,"/foo",true);
  assert_str_eq("/foo",(local_80.slots)->automations->param_path,"Parameter is learned",0xcc);
  assert_flt_eq(0.0,(float)local_b0,"Learning does not change values",0xcd);
  rtosc::AutomationMgr::setSlot(&local_80,0,1.0);
  assert_flt_eq(10.0,(float)local_b0,"Slot to max makes bound parameter max",0xcf);
  rtosc::AutomationMgr::setSlot(&local_80,0,0.0);
  assert_flt_eq(-1.0,(float)local_b0,"Slot to min makes bound parameter min",0xd1);
  rtosc::AutomationMgr::createBinding(&local_80,0,"/bar",true);
  assert_str_eq("/bar",(local_80.slots)->automations[1].param_path,"Parameter is learned",0xd3);
  assert_flt_eq(0.0,local_b0._4_4_,"Learning does not change values",0xd4);
  rtosc::AutomationMgr::setSlot(&local_80,0,1.0);
  assert_flt_eq(100.2,local_b0._4_4_,"Slot to max makes bound parameter max",0xd6);
  rtosc::AutomationMgr::setSlot(&local_80,0,0.0);
  assert_flt_eq(0.0,local_b0._4_4_,"Slot to min makes bound parameter min",0xd8);
  rtosc::AutomationMgr::~AutomationMgr(&local_80);
  return;
}

Assistant:

void suite(const char *s)
{ 
    printf("\n\n#SUITE: %s\n", s);
}